

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O0

void __thiscall
ObjectIdentifier::GetNextLong(ObjectIdentifier *this,char *start,char **next,unsigned_long *out)

{
  ulong uVar1;
  invalid_argument *piVar2;
  unsigned_long local_60;
  unsigned_long tmp;
  char *end;
  unsigned_long *out_local;
  char **next_local;
  char *start_local;
  ObjectIdentifier *this_local;
  
  tmp = 0;
  end = (char *)out;
  out_local = (unsigned_long *)next;
  next_local = (char **)start;
  start_local = (char *)this;
  uVar1 = strtoul(start,(char **)&tmp,10);
  if ((*(char *)tmp != '\0') && (*(char *)tmp != '.')) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Illegal OID");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((uVar1 == 0) && (next_local == (char **)tmp)) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Illegal OID");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  *(ulong *)end = uVar1;
  if (*(char *)tmp == '\0') {
    local_60 = 0;
  }
  else {
    local_60 = tmp + 1;
  }
  *out_local = local_60;
  return;
}

Assistant:

void ObjectIdentifier::GetNextLong(const char * start, const char *& next, unsigned long & out)
{
	char* end = nullptr;
	unsigned long tmp = strtoul(start, &end, 10);

	// If end is an invalid character, then fail
	switch (*end)
	{
	case '.':
	case '\0':
		break;
	default:
		throw std::invalid_argument("Illegal OID");
	}

	// 0 is a legal OID value
	// but it is how strtoul returns an error, which we can tell if end == start
	// for example if we had "1..2"
	if (tmp == 0 && start == end)
		throw std::invalid_argument("Illegal OID");

	out = tmp;
	next = *end == '\0' ? nullptr : end + 1;
}